

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

void __thiscall mkvmuxer::Chapter::Init(Chapter *this,uint *seed)

{
  uint64 uVar1;
  
  this->id_ = (char *)0x0;
  this->start_timecode_ = 0;
  this->end_timecode_ = 0;
  this->displays_ = (Display *)0x0;
  this->displays_size_ = 0;
  this->displays_count_ = 0;
  uVar1 = MakeUID(seed);
  this->uid_ = uVar1;
  return;
}

Assistant:

void Chapter::Init(unsigned int* seed) {
  id_ = NULL;
  start_timecode_ = 0;
  end_timecode_ = 0;
  displays_ = NULL;
  displays_size_ = 0;
  displays_count_ = 0;
  uid_ = MakeUID(seed);
}